

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddFullItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  size_t __n;
  pointer pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  long lVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  LinkType lt;
  char *pcVar8;
  bool bVar9;
  string file;
  string generator;
  string local_98;
  ItemIsPath local_74;
  key_type local_70;
  void *local_50;
  long *local_48 [2];
  long local_38 [2];
  FeatureDescriptor *local_28;
  
  bVar2 = CheckImplicitDirItem(this,entry);
  if (bVar2) {
    return;
  }
  if ((this->NoSONameUsesPath == true) && (bVar2 = CheckSharedLibNoSOName(this,entry), bVar2)) {
    return;
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_48);
  PVar3 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0008);
  if ((PVar3 != NEW) &&
     ((lVar5 = std::__cxx11::string::find((char *)local_48,0x77027d,0), lVar5 != -1 ||
      (lVar5 = std::__cxx11::string::find((char *)local_48,0x796af3,0), lVar5 != -1)))) {
    cmsys::SystemTools::GetFilenameName(&local_98,(string *)entry);
    bVar2 = cmsys::RegularExpression::find
                      (&this->ExtractAnyLibraryName,local_98._M_dataplus._M_p,
                       &(this->ExtractAnyLibraryName).regmatch);
    if (bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      HandleBadFullItem(this,entry,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) goto LAB_0043bc4e;
    }
  }
  if (this->LinkTypeEnabled == true) {
    cmsys::SystemTools::GetFilenameName(&local_98,(string *)entry);
    bVar2 = cmsys::RegularExpression::find
                      (&this->ExtractSharedLibraryName,local_98._M_dataplus._M_p,
                       &(this->ExtractSharedLibraryName).regmatch);
    lt = LinkShared;
    if (bVar2) {
LAB_0043bace:
      SetCurrentLinkType(this,lt);
    }
    else {
      bVar2 = cmsys::RegularExpression::find
                        (&this->ExtractStaticLibraryName,(entry->Item).Value._M_dataplus._M_p,
                         &(this->ExtractStaticLibraryName).regmatch);
      if (!bVar2) {
        lt = this->StartLinkType;
        goto LAB_0043bace;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = this->OldLinkDirMode;
  if (bVar2 == true) {
    cmsys::SystemTools::GetFilenamePath(&local_98,(string *)entry);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->OldLinkDirMask)._M_t,&local_98);
    bVar9 = (_Rb_tree_header *)cVar6._M_node ==
            &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header;
  }
  else {
    bVar9 = false;
  }
  if ((bVar2 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2)) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (bVar9) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OldLinkDirItems,(value_type *)entry);
  }
  local_74 = Yes;
  local_50 = (void *)0x0;
  __n = (entry->Feature)._M_string_length;
  if ((__n == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar4 = bcmp((entry->Feature)._M_dataplus._M_p,
                    cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,__n),
      iVar4 == 0)))) {
    bVar2 = entry->Kind == Object;
    pcVar8 = "__CMAKE_LINK_LIBRARY";
    if (bVar2) {
      pcVar8 = "__CMAKE_LINK_OBJECT";
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar8,pcVar8 + (0x14 - (ulong)bVar2));
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar1 = (entry->Feature)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1 + __n);
  }
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
          ::find(&(this->LibraryFeatureDescriptors)._M_t,&local_70);
  local_28 = (FeatureDescriptor *)0x0;
  if ((_Rb_tree_header *)cVar7._M_node !=
      &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
    local_28 = (FeatureDescriptor *)(cVar7._M_node + 2);
  }
  std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
  emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
            ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              *)this,&entry->Item,&local_74,&local_50,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_0043bc4e:
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFullItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;

  // Check for the implicit link directory special case.
  if (this->CheckImplicitDirItem(entry)) {
    return;
  }

  // Check for case of shared library with no builtin soname.
  if (this->NoSONameUsesPath && this->CheckSharedLibNoSOName(entry)) {
    return;
  }

  // Full path libraries should specify a valid library file name.
  // See documentation of CMP0008.
  std::string generator = this->GlobalGenerator->GetName();
  if (this->Target->GetPolicyStatusCMP0008() != cmPolicies::NEW &&
      (generator.find("Visual Studio") != std::string::npos ||
       generator.find("Xcode") != std::string::npos)) {
    std::string file = cmSystemTools::GetFilenameName(item.Value);
    if (!this->ExtractAnyLibraryName.find(file)) {
      this->HandleBadFullItem(entry, file);
      return;
    }
  }

  // This is called to handle a link item that is a full path.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if (this->LinkTypeEnabled) {
    std::string name = cmSystemTools::GetFilenameName(item.Value);
    if (this->ExtractSharedLibraryName.find(name)) {
      this->SetCurrentLinkType(LinkShared);
    } else if (!this->ExtractStaticLibraryName.find(item.Value)) {
      // We cannot determine the type.  Assume it is the target's
      // default type.
      this->SetCurrentLinkType(this->StartLinkType);
    }
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode &&
      !cm::contains(this->OldLinkDirMask,
                    cmSystemTools::GetFilenamePath(item.Value))) {
    this->OldLinkDirItems.push_back(item.Value);
  }

  // Now add the full path to the library.
  this->Items.emplace_back(
    item, ItemIsPath::Yes, nullptr,
    this->FindLibraryFeature(
      entry.Feature == DEFAULT
        ? (entry.Kind == cmComputeLinkDepends::LinkEntry::Object
             ? "__CMAKE_LINK_OBJECT"
             : "__CMAKE_LINK_LIBRARY")
        : entry.Feature));
}